

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

dgMatrix * __thiscall dgMatrix::Symetric3by3Inverse(dgMatrix *__return_storage_ptr__,dgMatrix *this)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  uVar8._0_4_ = (this->m_up).super_dgTemplateVector<float>.m_y;
  uVar8._4_4_ = (this->m_up).super_dgTemplateVector<float>.m_z;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar8;
  fVar13 = (this->m_right).super_dgTemplateVector<float>.m_x;
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_z;
  fVar2 = (this->m_right).super_dgTemplateVector<float>.m_z;
  auVar6 = vmovshdup_avx(auVar14);
  auVar17 = ZEXT416((uint)(this->m_right).super_dgTemplateVector<float>.m_y);
  auVar21 = ZEXT416((uint)(this->m_up).super_dgTemplateVector<float>.m_x);
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar13 * (float)(undefined4)uVar8)),auVar21,auVar17);
  uVar3._0_4_ = (this->m_front).super_dgTemplateVector<float>.m_x;
  uVar3._4_4_ = (this->m_front).super_dgTemplateVector<float>.m_y;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar3;
  auVar18 = vmovshdup_avx(auVar15);
  auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),auVar15,0x1c);
  fVar7 = auVar18._0_4_;
  auVar22._0_4_ = -auVar5._0_4_ * (float)(undefined4)uVar8;
  auVar22._4_4_ = -auVar5._4_4_ * (float)uVar8._4_4_;
  auVar22._8_4_ = -auVar5._8_4_ * 0.0;
  auVar22._12_4_ = -auVar5._12_4_ * 0.0;
  fVar16 = auVar6._0_4_ * fVar7 * fVar1;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 + fVar16)),ZEXT416((uint)fVar2),
                            ZEXT416((uint)((float)(undefined4)uVar3 * (float)(undefined4)uVar8)));
  auVar20 = vfmadd231ss_fma(auVar18,auVar22,ZEXT416((uint)fVar1));
  auVar18 = vmovshdup_avx(auVar22);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)(fVar7 * -fVar7)),ZEXT416((uint)fVar2));
  auVar18 = vfmadd213ss_fma(auVar18,auVar6,auVar20);
  dVar19 = 1.0 / (double)auVar18._0_4_;
  fVar16 = (float)(dVar19 * (double)auVar12._0_4_);
  if ((!NAN(fVar16)) && ((uint)ABS(fVar16) < 0x7f800000)) {
    auVar18 = vinsertps_avx(auVar6,auVar21,0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar2),0x10);
    auVar12._0_4_ = auVar6._0_4_ * auVar18._0_4_;
    auVar12._4_4_ = auVar6._4_4_ * auVar18._4_4_;
    auVar12._8_4_ = auVar6._8_4_ * auVar18._8_4_;
    auVar12._12_4_ = auVar6._12_4_ * auVar18._12_4_;
    auVar18 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar13),0x10);
    auVar6 = vfmsub231ps_fma(auVar12,auVar14,auVar18);
    auVar6 = vcvtps2pd_avx(auVar6);
    auVar20._0_8_ = dVar19 * auVar6._0_8_;
    auVar20._8_8_ = dVar19 * auVar6._8_8_;
    auVar6 = vcvtpd2ps_avx(auVar20);
    auVar20 = vmovshdup_avx(auVar6);
    if (!NAN(auVar20._0_4_)) {
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar12 = vandps_avx512vl(auVar6,auVar21);
      auVar9._8_4_ = 0x7f7fffff;
      auVar9._0_8_ = 0x7f7fffff7f7fffff;
      auVar9._12_4_ = 0x7f7fffff;
      uVar8 = vpcmpgtd_avx512vl(auVar12,auVar9);
      if (((uVar8 & 1) == 0) && (((uVar8 & 0xf) >> 1 & 1) == 0)) {
        auVar12 = vinsertps_avx(ZEXT416((uint)fVar1),auVar17,0x10);
        auVar17._0_4_ = auVar5._0_4_ * auVar12._0_4_;
        auVar17._4_4_ = auVar5._4_4_ * auVar12._4_4_;
        auVar17._8_4_ = auVar5._8_4_ * auVar12._8_4_;
        auVar17._12_4_ = auVar5._12_4_ * auVar12._12_4_;
        auVar5 = vfmsub213ps_fma(auVar18,auVar15,auVar17);
        auVar5 = vcvtps2pd_avx(auVar5);
        auVar18._0_8_ = dVar19 * auVar5._0_8_;
        auVar18._8_8_ = dVar19 * auVar5._8_8_;
        auVar5 = vcvtpd2ps_avx(auVar18);
        auVar18 = vmovshdup_avx(auVar5);
        if (!NAN(auVar18._0_4_)) {
          auVar10._8_4_ = 0x7fffffff;
          auVar10._0_8_ = 0x7fffffff7fffffff;
          auVar10._12_4_ = 0x7fffffff;
          auVar12 = vandps_avx512vl(auVar5,auVar10);
          auVar11._8_4_ = 0x7f7fffff;
          auVar11._0_8_ = 0x7f7fffff7f7fffff;
          auVar11._12_4_ = 0x7f7fffff;
          uVar8 = vpcmpgtd_avx512vl(auVar12,auVar11);
          if ((((uVar8 & 0xf) >> 1 & 1) == 0) && ((uVar8 & 1) == 0)) {
            auVar12 = vfmadd213ss_fma(auVar14,auVar15,ZEXT416((uint)(fVar7 * -fVar7)));
            fVar13 = (float)(dVar19 * (double)auVar12._0_4_);
            if ((uint)ABS(fVar13) < 0x7f800000) {
              uVar4 = vmovlps_avx(auVar6);
              (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x =
                   (float)(int)uVar4;
              (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y =
                   (float)(int)((ulong)uVar4 >> 0x20);
              (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z = fVar16;
              (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w = 0.0;
              (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x = auVar20._0_4_;
              uVar4 = vmovlps_avx(auVar5);
              (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y = (float)(int)uVar4;
              (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z =
                   (float)(int)((ulong)uVar4 >> 0x20);
              (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w = 0.0;
              (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_x = fVar16;
              (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_y = auVar18._0_4_;
              (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_z = fVar13;
              *(undefined1 (*) [16])
               &(__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_w =
                   ZEXT416(0) << 0x20;
              (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_w = 1.0;
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgMatrix dgMatrix::Symetric3by3Inverse () const
{
	const dgMatrix& mat = *this;
	hacd::HaF64 det = mat[0][0] * mat[1][1] * mat[2][2] + 
			mat[0][1] * mat[1][2] * mat[0][2] * hacd::HaF32 (2.0f) -
			mat[0][2] * mat[1][1] * mat[0][2] -
			mat[0][1] * mat[0][1] * mat[2][2] -
			mat[0][0] * mat[1][2] * mat[1][2];

	det = hacd::HaF32 (1.0f) / det;

	hacd::HaF32 x11 = (hacd::HaF32)(det * (mat[1][1] * mat[2][2] - mat[1][2] * mat[1][2]));  
	hacd::HaF32 x22 = (hacd::HaF32)(det * (mat[0][0] * mat[2][2] - mat[0][2] * mat[0][2]));  
	hacd::HaF32 x33 = (hacd::HaF32)(det * (mat[0][0] * mat[1][1] - mat[0][1] * mat[0][1]));  

	hacd::HaF32 x12 = (hacd::HaF32)(det * (mat[1][2] * mat[2][0] - mat[1][0] * mat[2][2]));  
	hacd::HaF32 x13 = (hacd::HaF32)(det * (mat[1][0] * mat[2][1] - mat[1][1] * mat[2][0]));  
	hacd::HaF32 x23 = (hacd::HaF32)(det * (mat[0][1] * mat[2][0] - mat[0][0] * mat[2][1]));  


#ifdef _DEBUG
	dgMatrix matInv (dgVector (x11, x12, x13, hacd::HaF32(0.0f)),
				     dgVector (x12, x22, x23, hacd::HaF32(0.0f)),
					 dgVector (x13, x23, x33, hacd::HaF32(0.0f)),
					 dgVector (hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(1.0f)));

	dgMatrix test (matInv * mat);
	HACD_ASSERT (dgAbsf (test[0][0] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
	HACD_ASSERT (dgAbsf (test[1][1] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
	HACD_ASSERT (dgAbsf (test[2][2] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
#endif

	return dgMatrix (dgVector (x11, x12, x13, hacd::HaF32(0.0f)),
					 dgVector (x12, x22, x23, hacd::HaF32(0.0f)),
					 dgVector (x13, x23, x33, hacd::HaF32(0.0f)),
					 dgVector (hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(1.0f)));
}